

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crt_abstractions.c
# Opt level: O3

FLOAT_STRING_TYPE
splitFloatString(char *nptr,char **endptr,int *signal,double *fraction,int *exponential)

{
  byte bVar1;
  int iVar2;
  FLOAT_STRING_TYPE FVar3;
  unsigned_long_long uVar4;
  int *piVar5;
  byte *pbVar6;
  long lVar7;
  byte *pbVar8;
  double dVar9;
  undefined1 auVar10 [16];
  double local_60;
  unsigned_long_long local_58;
  
  while( true ) {
    *endptr = nptr;
    if ((4 < (byte)*nptr - 9) && (*nptr != 0x20)) break;
    nptr = (char *)((byte *)nptr + 1);
  }
  *signal = 1;
  if (*nptr == 0x2b) {
LAB_0010ed64:
    nptr = (char *)((byte *)nptr + 1);
    *endptr = nptr;
  }
  else if (*nptr == 0x2d) {
    *signal = -1;
    goto LAB_0010ed64;
  }
  iVar2 = substricmp(nptr,"INF");
  if (iVar2 == 0) {
    *endptr = (char *)((byte *)nptr + 3);
    iVar2 = substricmp((char *)((byte *)nptr + 3),"INITY");
    if (iVar2 != 0) {
      return FST_INFINITY;
    }
    *endptr = (char *)((byte *)nptr + 8);
    return FST_INFINITY;
  }
  iVar2 = substricmp(nptr,"NAN");
  if (iVar2 == 0) {
    if (((byte *)nptr)[3] == 0x28) {
      pbVar6 = (byte *)nptr + 4;
      do {
        bVar1 = *pbVar6;
        pbVar6 = pbVar6 + 1;
        if (bVar1 == 0x29) break;
      } while (bVar1 != 0);
      if (bVar1 != 0x29) goto LAB_0010ed99;
    }
    else {
      pbVar6 = (byte *)nptr + 3;
    }
    *endptr = (char *)pbVar6;
    FVar3 = FST_NAN;
  }
  else {
LAB_0010ed99:
    FVar3 = FST_ERROR;
    if ((byte)(*nptr - 0x30U) < 10) {
      uVar4 = strtoull_s(nptr,endptr,10);
      pbVar6 = (byte *)*endptr;
      iVar2 = 3;
      if (uVar4 == 0xffffffffffffffff) {
        piVar5 = __errno_location();
        iVar2 = 4 - (uint)(*piVar5 == 0);
      }
      bVar1 = *pbVar6;
      if (bVar1 == 0x2e) {
        local_58 = strtoull_s((char *)(pbVar6 + 1),endptr,10);
        pbVar8 = (byte *)*endptr;
        if ((local_58 == 0xffffffffffffffff) && (piVar5 = __errno_location(), *piVar5 != 0)) {
          iVar2 = 4;
        }
        bVar1 = *pbVar8;
        local_60 = (double)((int)pbVar8 - (int)(pbVar6 + 1));
      }
      else {
        local_60 = 0.0;
        local_58 = 0;
        pbVar8 = pbVar6;
      }
      if ((bVar1 | 0x20) == 0x65) {
        lVar7 = strtol((char *)(pbVar8 + 1),endptr,10);
        *exponential = (int)lVar7;
        if (0x268 < (int)lVar7 + 0x134U) {
          return FST_OVERFLOW;
        }
      }
      else {
        *exponential = 0;
      }
      FVar3 = FST_OVERFLOW;
      if (iVar2 == 3) {
        iVar2 = (int)pbVar6 - (int)nptr;
        dVar9 = pow(10.0,local_60);
        lVar7 = uVar4 * ((long)(dVar9 - 9.223372036854776e+18) & (long)dVar9 >> 0x3f | (long)dVar9)
                + local_58;
        auVar10._8_4_ = (int)((ulong)lVar7 >> 0x20);
        auVar10._0_8_ = lVar7;
        auVar10._12_4_ = 0x45300000;
        dVar9 = pow(10.0,(double)iVar2 + local_60 + -1.0);
        *fraction = ((auVar10._8_8_ - 1.9342813113834067e+25) +
                    ((double)CONCAT44(0x43300000,(int)lVar7) - 4503599627370496.0)) / dVar9;
        *exponential = *exponential + iVar2 + -1;
        FVar3 = FST_NUMBER;
      }
    }
  }
  return FVar3;
}

Assistant:

static FLOAT_STRING_TYPE splitFloatString(const char* nptr, char** endptr, int *signal, double *fraction, int *exponential)
{
    FLOAT_STRING_TYPE result = FST_ERROR;

    unsigned long long ullInteger = 0;
    unsigned long long ullFraction = 0;
    int integerSize = 0;
    int fractionSize = 0;
    char* startptr;

    (*endptr) = (char*)nptr;

    /*Codes_SRS_CRT_ABSTRACTIONS_21_018: [The white-space for strtof_s must be one of the characters ' ', '\f', '\n', '\r', '\t', '\v'.]*/
    /*Codes_SRS_CRT_ABSTRACTIONS_21_028: [The white-space for strtold_s must be one of the characters ' ', '\f', '\n', '\r', '\t', '\v'.]*/
    while (IS_SPACE(**endptr))
    {
        (*endptr)++;
    }

    /*Codes_SRS_CRT_ABSTRACTIONS_21_019: [The valid sequence for strtof_s starts after the first non-white - space character, followed by an optional positive or negative sign, a number, 'INF', or 'NAN' (ignoring case).]*/
    /*Codes_SRS_CRT_ABSTRACTIONS_21_029: [The valid sequence for strtold_s starts after the first non-white - space character, followed by an optional positive or negative sign, a number, 'INF', or 'NAN' (ignoring case).]*/
    (*signal) = +1;
    if ((**endptr) == '+')
    {
        (*endptr)++;
    }
    else if ((**endptr) == '-')
    {
        (*signal) = -1;
        (*endptr)++;
    }

    /*Codes_SRS_CRT_ABSTRACTIONS_21_023: [If the string is 'INF' of 'INFINITY' (ignoring case), the strtof_s must return the INFINITY value for float.]*/
    /*Codes_SRS_CRT_ABSTRACTIONS_21_033: [If the string is 'INF' of 'INFINITY' (ignoring case), the strtold_s must return the INFINITY value for long double.]*/
    if (isInfinity((const char**)endptr))
    {
        result = FST_INFINITY;
    }
    /*Codes_SRS_CRT_ABSTRACTIONS_21_034: [If the string is 'NAN' or 'NAN(...)' (ignoring case), the strtold_s must return 0.0 and points endptr to the first character after the 'NAN' sequence.]*/
    /*Codes_SRS_CRT_ABSTRACTIONS_21_024: [If the string is 'NAN' or 'NAN(...)' (ignoring case), the strtof_s must return 0.0f and points endptr to the first character after the 'NAN' sequence.]*/
    else if (isNaN((const char**)endptr))
    {
        result = FST_NAN;
    }
    else if (IN_BASE_RANGE(DIGIT_VAL(**endptr), 10))
    {
        result = FST_NUMBER;
        startptr = *endptr;
        /* integers will go to the fraction and exponential. */
        ullInteger = strtoull_s(startptr, endptr, 10);
        integerSize = (int)((*endptr) - startptr);
        if ((ullInteger == ULLONG_MAX) && (errno != 0))
        {
            result = FST_OVERFLOW;
        }

        /* get the real fraction part, if exist. */
        if ((**endptr) == '.')
        {
            startptr = (*endptr) + 1;
            ullFraction = strtoull_s(startptr, endptr, 10);
            fractionSize = (int)((*endptr) - startptr);
            if ((ullFraction == ULLONG_MAX) && (errno != 0))
            {
                result = FST_OVERFLOW;
            }
        }

        if (((**endptr) == 'e') || ((**endptr) == 'E'))
        {
            startptr = (*endptr) + 1;
            (*exponential) = (int)strtol(startptr, endptr, 10);
            if (((*exponential) < (DBL_MAX_10_EXP * (-1))) || ((*exponential) > DBL_MAX_10_EXP))
            {
                result = FST_OVERFLOW;
            }
        }
        else
        {
            (*exponential) = 0;
        }

        if (result == FST_NUMBER)
        {
            /* Add ullInteger to ullFraction. */
            ullFraction += (ullInteger * (unsigned long long)(pow(10, (double)fractionSize)));
            (*fraction) = ((double)ullFraction / (pow(10.0f, ((double)fractionSize + (double)integerSize - 1.00))));

            /* Unify rest of integerSize and fractionSize in the exponential. */
            (*exponential) += integerSize - 1;
        }
    }

    return result;
}